

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall HighFreqPub::~HighFreqPub(HighFreqPub *this)

{
  string *in_RDI;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    zsock_destroy_checked
              ((zsock_t **)(in_RDI + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0x13);
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

HighFreqPub::~HighFreqPub() {
    if (hfPub != NULL) {
        zsock_destroy(&hfPub);
        hfPub = NULL;
    }
}